

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_ushl_b_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  uintptr_t i;
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  
  uVar1 = (ulong)((desc & 0x1f) * 8 + 8);
  uVar2 = 0;
  do {
    if (uVar1 == uVar2) {
      for (; uVar1 < (desc >> 2 & 0xf8) + 8; uVar1 = uVar1 + 8) {
        *(undefined8 *)((long)vd + uVar1) = 0;
      }
      return;
    }
    bVar3 = *(byte *)((long)vm + uVar2);
    if ((char)bVar3 < '\0') {
      if (bVar3 < 0xf9) goto LAB_0056a5cd;
      bVar3 = *(byte *)((long)vn + uVar2) >> (-bVar3 & 0x1f);
    }
    else if (bVar3 < 8) {
      bVar3 = *(byte *)((long)vn + uVar2) << (bVar3 & 0x1f);
    }
    else {
LAB_0056a5cd:
      bVar3 = 0;
    }
    *(byte *)((long)vd + uVar2) = bVar3;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void HELPER(gvec_ushl_b)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc);
    uint8_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz; ++i) {
        int8_t mm = m[i];
        uint8_t nn = n[i];
        uint8_t res = 0;
        if (mm >= 0) {
            if (mm < 8) {
                res = nn << mm;
            }
        } else {
            if (mm > -8) {
                res = nn >> -mm;
            }
        }
        d[i] = res;
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}